

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Rotate
          (FormattingScene *this,Float angle,Float ax,Float ay,Float az,FileLoc loc)

{
  Float local_58;
  Float local_54;
  Float local_50;
  Float local_4c;
  string local_48;
  
  local_58 = az;
  local_54 = ay;
  local_50 = ax;
  local_4c = angle;
  indent_abi_cxx11_(&local_48,this,0);
  Printf<std::__cxx11::string,float&,float&,float&,float&>
            ("%sRotate %f %f %f %f\n",&local_48,&local_4c,&local_50,&local_54,&local_58);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void FormattingScene::Rotate(Float angle, Float ax, Float ay, Float az, FileLoc loc) {
    Printf("%sRotate %f %f %f %f\n", indent(), angle, ax, ay, az);
}